

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O0

void mod2sparse_print_terminal(mod2sparse *A)

{
  uint uVar1;
  mod2dense *r;
  undefined4 *in_RDI;
  int j;
  int i;
  mod2dense *Adense;
  int N;
  int M;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int iVar2;
  int in_stack_ffffffffffffffe4;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  uVar5 = *in_RDI;
  uVar4 = in_RDI[1];
  r = mod2dense_allocate(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  mod2sparse_to_dense((mod2sparse *)CONCAT44(uVar5,uVar4),r);
  for (iVar3 = 0; iVar3 < r->n_rows; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iVar2 < r->n_cols; iVar2 = iVar2 + 1) {
      uVar1 = mod2dense_get((mod2dense *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffdc,
                            in_stack_ffffffffffffffd8);
      printf("%d",(ulong)uVar1);
    }
    printf("\n");
  }
  mod2dense_free((mod2dense *)0x16e320);
  return;
}

Assistant:

void mod2sparse_print_terminal(mod2sparse *A){
  int M,N;
  mod2dense *Adense;
  M=mod2sparse_rows(A);
  N=mod2sparse_cols(A);

  Adense=mod2dense_allocate(M,N);

  mod2sparse_to_dense(A,Adense);
for (int i = 0; i<mod2dense_rows(Adense); i++)
  { for (int j = 0; j<mod2dense_cols(Adense); j++)
    { printf("%d",mod2dense_get(Adense,i,j));
    }
    printf("\n");
  }

  mod2dense_free(Adense);

}